

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

Atom_p __thiscall indigox::Molecule::NewAtom(Molecule *this,Element_p *e)

{
  Atom *this_00;
  __shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Atom_p AVar1;
  __shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  NewAtom(this);
  this_00 = (Atom *)(this->super_CountableObject<indigox::Molecule>).id_;
  std::__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_30,in_RDX);
  Atom::SetElement(this_00,(Element_p *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Atom_p)AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Molecule::NewAtom(Element_p e) {
  Atom_p atm = NewAtom();
  atm->SetElement(e);
  return atm;
}